

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDVertex::RemoveFaceFromArray(ON_SubDVertex *this,ON_SubDFace *f)

{
  ON_SubDFace *vf;
  unsigned_short vfi;
  unsigned_short new_count;
  ON_SubDFace *f_local;
  ON_SubDVertex *this_local;
  
  if (((f == (ON_SubDFace *)0x0) || (this->m_face_count == 0)) ||
     (this->m_faces == (ON_SubDFace **)0x0)) {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    vf._6_2_ = 0;
    for (vf._4_2_ = 0; vf._4_2_ < this->m_face_count; vf._4_2_ = vf._4_2_ + 1) {
      if (f != this->m_faces[vf._4_2_]) {
        this->m_faces[vf._6_2_] = this->m_faces[vf._4_2_];
        vf._6_2_ = vf._6_2_ + 1;
      }
    }
    if (vf._6_2_ == this->m_face_count) {
      this_local._7_1_ = false;
    }
    else {
      this->m_face_count = vf._6_2_;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDVertex::RemoveFaceFromArray(const ON_SubDFace * f)
{
  if (nullptr == f || 0 == m_face_count || nullptr == m_faces)
    return ON_SUBD_RETURN_ERROR(false);
  unsigned short new_count = 0;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* vf = m_faces[vfi];
    if (f == vf)
      continue;
    m_faces[new_count++] = vf;
  }
  if (new_count == m_face_count)
    return false;
  m_face_count = new_count;
  return true;
}